

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  Lit *pLVar1;
  ShrinkStackElem *__ptr;
  char *pcVar2;
  int *piVar3;
  uint *puVar4;
  VarData *__ptr_00;
  lbool *plVar5;
  double *__ptr_01;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0011abd8;
  pLVar1 = (this->add_tmp).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->add_tmp).sz = 0;
    free(pLVar1);
    (this->add_tmp).data = (Lit *)0x0;
    (this->add_tmp).cap = 0;
  }
  pLVar1 = (this->analyze_toclear).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->analyze_toclear).sz = 0;
    free(pLVar1);
    (this->analyze_toclear).data = (Lit *)0x0;
    (this->analyze_toclear).cap = 0;
  }
  __ptr = (this->analyze_stack).data;
  if (__ptr != (ShrinkStackElem *)0x0) {
    (this->analyze_stack).sz = 0;
    free(__ptr);
    (this->analyze_stack).data = (ShrinkStackElem *)0x0;
    (this->analyze_stack).cap = 0;
  }
  pcVar2 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar2 != (char *)0x0) {
    (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar2);
    (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
    (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  piVar3 = (this->free_vars).data;
  if (piVar3 != (int *)0x0) {
    (this->free_vars).sz = 0;
    free(piVar3);
    (this->free_vars).data = (int *)0x0;
    (this->free_vars).cap = 0;
  }
  piVar3 = (this->released_vars).data;
  if (piVar3 != (int *)0x0) {
    (this->released_vars).sz = 0;
    free(piVar3);
    (this->released_vars).data = (int *)0x0;
    (this->released_vars).cap = 0;
  }
  puVar4 = (this->ca).ra.memory;
  if (puVar4 != (uint *)0x0) {
    free(puVar4);
  }
  piVar3 = (this->order_heap).indices.map.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap).indices.map.sz = 0;
    free(piVar3);
    (this->order_heap).indices.map.data = (int *)0x0;
    (this->order_heap).indices.map.cap = 0;
  }
  piVar3 = (this->order_heap).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->order_heap).heap.sz = 0;
    free(piVar3);
    (this->order_heap).heap.data = (int *)0x0;
    (this->order_heap).heap.cap = 0;
  }
  pLVar1 = (this->watches).dirties.data;
  if (pLVar1 != (Lit *)0x0) {
    (this->watches).dirties.sz = 0;
    free(pLVar1);
    (this->watches).dirties.data = (Lit *)0x0;
    (this->watches).dirties.cap = 0;
  }
  pcVar2 = (this->watches).dirty.map.data;
  if (pcVar2 != (char *)0x0) {
    (this->watches).dirty.map.sz = 0;
    free(pcVar2);
    (this->watches).dirty.map.data = (char *)0x0;
    (this->watches).dirty.map.cap = 0;
  }
  vec<Minisat::vec<Minisat::Solver::Watcher,_int>,_int>::clear
            ((vec<Minisat::vec<Minisat::Solver::Watcher,_int>,_int> *)&this->watches,true);
  __ptr_00 = (this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
  if (__ptr_00 != (VarData *)0x0) {
    (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
    sz = 0;
    free(__ptr_00);
    (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
    data = (VarData *)0x0;
    (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
    cap = 0;
  }
  pcVar2 = (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar2 != (char *)0x0) {
    (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar2);
    (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
    (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  plVar5 = (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
           data;
  if (plVar5 != (lbool *)0x0) {
    (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(plVar5);
    (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data =
         (lbool *)0x0;
    (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  pcVar2 = (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
  if (pcVar2 != (char *)0x0) {
    (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(pcVar2);
    (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
    (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  plVar5 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
  ;
  if (plVar5 != (lbool *)0x0) {
    (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(plVar5);
    (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data =
         (lbool *)0x0;
    (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  __ptr_01 = (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.data;
  if (__ptr_01 != (double *)0x0) {
    (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
    free(__ptr_01);
    (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.data =
         (double *)0x0;
    (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  }
  pLVar1 = (this->assumptions).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->assumptions).sz = 0;
    free(pLVar1);
    (this->assumptions).data = (Lit *)0x0;
    (this->assumptions).cap = 0;
  }
  piVar3 = (this->trail_lim).data;
  if (piVar3 != (int *)0x0) {
    (this->trail_lim).sz = 0;
    free(piVar3);
    (this->trail_lim).data = (int *)0x0;
    (this->trail_lim).cap = 0;
  }
  pLVar1 = (this->trail).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->trail).sz = 0;
    free(pLVar1);
    (this->trail).data = (Lit *)0x0;
    (this->trail).cap = 0;
  }
  puVar4 = (this->learnts).data;
  if (puVar4 != (uint *)0x0) {
    (this->learnts).sz = 0;
    free(puVar4);
    (this->learnts).data = (uint *)0x0;
    (this->learnts).cap = 0;
  }
  puVar4 = (this->clauses).data;
  if (puVar4 != (uint *)0x0) {
    (this->clauses).sz = 0;
    free(puVar4);
    (this->clauses).data = (uint *)0x0;
    (this->clauses).cap = 0;
  }
  pLVar1 = (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.data;
  if (pLVar1 != (Lit *)0x0) {
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.sz = 0;
    free(pLVar1);
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.data = (Lit *)0x0;
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.cap = 0;
  }
  pcVar2 = (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.data;
  if (pcVar2 != (char *)0x0) {
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.sz = 0;
    free(pcVar2);
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.data = (char *)0x0;
    (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.cap = 0;
  }
  plVar5 = (this->model).data;
  if (plVar5 != (lbool *)0x0) {
    (this->model).sz = 0;
    free(plVar5);
    (this->model).data = (lbool *)0x0;
    (this->model).cap = 0;
  }
  return;
}

Assistant:

Solver::~Solver()
{
}